

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
ON_ObjectRenderingAttributes::AddMappingChannel
          (ON_ObjectRenderingAttributes *this,ON_UUID *plugin_id,int mapping_channel_id,
          ON_UUID *mapping_id)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  bool bVar4;
  ON_MappingRef *pOVar5;
  ON_MappingChannel *pOVar6;
  long lVar7;
  ON_Xform *pOVar8;
  ON_Xform *pOVar9;
  byte bVar10;
  
  bVar10 = 0;
  pOVar5 = MappingRef(this,plugin_id);
  if (pOVar5 != (ON_MappingRef *)0x0) {
    bVar4 = ON_MappingRef::AddMappingChannel(pOVar5,mapping_channel_id,mapping_id);
    return bVar4;
  }
  pOVar5 = ON_ClassArray<ON_MappingRef>::AppendNew(&this->m_mappings);
  uVar2 = plugin_id->Data2;
  uVar3 = plugin_id->Data3;
  uVar1 = *(undefined8 *)plugin_id->Data4;
  (pOVar5->m_plugin_id).Data1 = plugin_id->Data1;
  (pOVar5->m_plugin_id).Data2 = uVar2;
  (pOVar5->m_plugin_id).Data3 = uVar3;
  *(undefined8 *)(pOVar5->m_plugin_id).Data4 = uVar1;
  pOVar6 = ON_SimpleArray<ON_MappingChannel>::AppendNew(&pOVar5->m_mapping_channels);
  pOVar6->m_mapping_channel_id = mapping_channel_id;
  uVar2 = mapping_id->Data2;
  uVar3 = mapping_id->Data3;
  uVar1 = *(undefined8 *)mapping_id->Data4;
  (pOVar6->m_mapping_id).Data1 = mapping_id->Data1;
  (pOVar6->m_mapping_id).Data2 = uVar2;
  (pOVar6->m_mapping_id).Data3 = uVar3;
  *(undefined8 *)(pOVar6->m_mapping_id).Data4 = uVar1;
  pOVar6->m_mapping_index = -1;
  pOVar8 = &ON_Xform::IdentityTransformation;
  pOVar9 = &pOVar6->m_object_xform;
  for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
    pOVar9->m_xform[0][0] = pOVar8->m_xform[0][0];
    pOVar8 = (ON_Xform *)((long)pOVar8 + ((ulong)bVar10 * -2 + 1) * 8);
    pOVar9 = (ON_Xform *)((long)pOVar9 + (ulong)bVar10 * -0x10 + 8);
  }
  return true;
}

Assistant:

bool ON_ObjectRenderingAttributes::AddMappingChannel(
        const ON_UUID& plugin_id,
        int mapping_channel_id,
        const ON_UUID& mapping_id
        )
{
  ON_MappingRef* mr = const_cast<ON_MappingRef*>(MappingRef(plugin_id));
  if ( !mr )
  {
    mr = &m_mappings.AppendNew();
    mr->m_plugin_id = plugin_id;
    ON_MappingChannel& mc = mr->m_mapping_channels.AppendNew();
    mc.m_mapping_channel_id = mapping_channel_id;
    mc.m_mapping_id = mapping_id;
    mc.m_mapping_index = -1; // 27th October 2011 John Croudy - constructor is not called by AppendNew().
    mc.m_object_xform = ON_Xform::IdentityTransformation;
    return true;
  }

  return mr->AddMappingChannel(mapping_channel_id,mapping_id);
}